

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

void write_modes_b(AV1_COMP *cpi,ThreadData *td,TileInfo *tile,aom_writer *w,TokenExtra **tok,
                  TokenExtra *tok_end,int mi_row,int mi_col)

{
  AV1_COMMON *cm;
  segmentation *psVar1;
  MB_MODE_INFO **ppMVar2;
  uint16_t *icdf;
  uint8_t *puVar3;
  aom_cdf_prob (*paaaVar4) [3] [3];
  aom_cdf_prob (*icdf_00) [2] [3];
  BLOCK_SIZE BVar5;
  byte bVar6;
  uint8_t uVar7;
  bool bVar8;
  MOTION_MODE MVar9;
  BLOCK_SIZE BVar10;
  ushort uVar11;
  ushort uVar12;
  uint32_t uVar13;
  FRAME_CONTEXT *pFVar14;
  MB_MODE_INFO_EXT_FRAME *pMVar15;
  MB_MODE_INFO *pMVar16;
  MB_MODE_INFO **ppMVar17;
  FRAME_CONTEXT *pFVar18;
  SequenceHeader *pSVar19;
  MB_MODE_INFO_EXT_FRAME *pMVar20;
  MB_MODE_INFO *pMVar21;
  byte bVar22;
  aom_bit_depth_t aVar23;
  short sVar24;
  WarpedMotionParams *pWVar25;
  aom_cdf_prob (*paaVar26) [3];
  macroblockd_plane *pmVar27;
  ushort uVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  uint uVar32;
  long lVar33;
  MV_REFERENCE_FRAME *pMVar34;
  ulong uVar35;
  int_mv *piVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  MB_MODE_INFO *pMVar41;
  TokenExtra *pTVar42;
  MV *mv;
  RefCntBuffer *pRVar43;
  uint16_t uVar44;
  scale_factors *psVar45;
  ulong uVar46;
  size_t __n;
  ThreadData *pTVar47;
  aom_cdf_prob (*paaVar48) [3];
  ulong uVar49;
  int iVar50;
  MACROBLOCKD *pMVar51;
  short sVar52;
  int idx;
  uint uVar53;
  aom_cdf_prob (*icdf_01) [6] [3];
  aom_cdf_prob (*icdf_02) [9];
  aom_cdf_prob *paVar54;
  char cVar55;
  char cVar56;
  char cVar57;
  char cVar58;
  uint uVar59;
  TXFM_CONTEXT *__s;
  long lVar60;
  RefCntBuffer *pRVar61;
  uint uVar62;
  ulong uVar63;
  aom_bit_depth_t aVar64;
  aom_bit_depth_t bit_depth;
  nmv_context *nmvc;
  uint uVar65;
  aom_cdf_prob (*paaVar66) [4];
  aom_cdf_prob (*icdf_03) [5];
  bool bVar67;
  MACROBLOCKD *xd;
  int_mv ref_mv;
  MB_MODE_INFO *in_stack_fffffffffffffee8;
  ThreadData *pTVar68;
  MB_MODE_INFO *pMVar69;
  MB_MODE_INFO *pMVar70;
  MB_MODE_INFO *pMVar71;
  MACROBLOCKD *xd_00;
  MACROBLOCKD *xd_01;
  undefined8 local_70;
  undefined4 local_68;
  ulong local_60;
  ulong local_58;
  AV1_COMP *local_50;
  ulong local_48;
  macroblockd_plane *local_40;
  TokenExtra **local_38;
  
  pFVar14 = (td->mb).e_mbd.tile_ctx;
  iVar30 = (cpi->common).mi_params.mi_stride;
  uVar59 = (uint)tok_end;
  iVar29 = iVar30 * uVar59 + mi_row;
  ppMVar2 = (cpi->common).mi_params.mi_grid_base + iVar29;
  (td->mb).e_mbd.mi = ppMVar2;
  pMVar15 = (cpi->mbmi_ext_info).frame_base;
  lVar33 = (long)((int)((long)((ulong)(uint)((int)uVar59 >> 0x1f) << 0x20 |
                              (ulong)tok_end & 0xffffffff) /
                       (long)(int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                        [(cpi->common).mi_params.mi_alloc_bsize]) *
                  (cpi->mbmi_ext_info).stride +
                 mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                     [(cpi->common).mi_params.mi_alloc_bsize]);
  local_40 = (macroblockd_plane *)(lVar33 * 0x54);
  pMVar20 = pMVar15 + lVar33;
  (td->mb).mbmi_ext_frame = pMVar20;
  (td->mb).e_mbd.tx_type_map = (cpi->common).mi_params.tx_type_map + iVar29;
  (td->mb).e_mbd.tx_type_map_stride = iVar30;
  pMVar16 = *ppMVar2;
  local_60 = (ulong)pMVar16->bsize;
  bVar39 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[local_60];
  bVar40 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[local_60];
  iVar30 = (cpi->common).mi_params.mi_rows;
  iVar29 = (cpi->common).mi_params.mi_cols;
  (td->mb).e_mbd.mb_to_top_edge = uVar59 * -0x20;
  local_58 = (ulong)bVar39;
  (td->mb).e_mbd.mb_to_bottom_edge = (iVar30 - (bVar39 + uVar59)) * 0x20;
  (td->mb).e_mbd.mb_to_left_edge = mi_row * -0x20;
  local_48 = (ulong)bVar40;
  (td->mb).e_mbd.mb_to_right_edge = (iVar29 - ((uint)bVar40 + mi_row)) * 0x20;
  (td->mb).e_mbd.mi_row = uVar59;
  (td->mb).e_mbd.mi_col = mi_row;
  iVar30 = tile->mi_row_start;
  (td->mb).e_mbd.up_available = iVar30 < (int)uVar59;
  uVar65 = (td->mb).e_mbd.plane[1].subsampling_x;
  uVar32 = (td->mb).e_mbd.plane[1].subsampling_y;
  iVar29 = tile->mi_col_start;
  (td->mb).e_mbd.chroma_up_available = iVar30 < (int)uVar59;
  (td->mb).e_mbd.left_available = iVar29 < mi_row;
  bVar67 = iVar29 < mi_row + -1;
  if (uVar65 == 0) {
    bVar67 = iVar29 < mi_row;
  }
  if ((0x3efffcUL >> (local_60 & 0x3f) & 1) != 0) {
    bVar67 = iVar29 < mi_row;
  }
  (td->mb).e_mbd.chroma_left_available = bVar67;
  if ((0x20005UL >> (local_60 & 0x3f) & 1) != 0 && uVar32 != 0) {
    (td->mb).e_mbd.chroma_up_available = iVar30 < (int)(uVar59 - 1);
  }
  if (iVar30 < (int)uVar59) {
    pMVar41 = (td->mb).e_mbd.mi[-(long)(td->mb).e_mbd.mi_stride];
  }
  else {
    pMVar41 = (MB_MODE_INFO *)0x0;
  }
  (td->mb).e_mbd.above_mbmi = pMVar41;
  if (iVar29 < mi_row) {
    pMVar41 = (td->mb).e_mbd.mi[-1];
  }
  else {
    pMVar41 = (MB_MODE_INFO *)0x0;
  }
  (td->mb).e_mbd.left_mbmi = pMVar41;
  if ((((ulong)tok_end & 1) == 0) && ((bVar39 & uVar32 != 0) != 0)) {
    (td->mb).e_mbd.is_chroma_ref = false;
  }
  else {
    if (((mi_row & 1U) == 0) && ((bVar40 & 1) != 0)) {
      (td->mb).e_mbd.is_chroma_ref = uVar65 == 0;
      if (uVar65 != 0) goto LAB_0019c1a6;
    }
    else {
      (td->mb).e_mbd.is_chroma_ref = true;
    }
    iVar30 = (td->mb).e_mbd.mi_stride;
    iVar29 = (uVar65 & mi_row) + (uVar32 & uVar59) * iVar30;
    ppMVar17 = (td->mb).e_mbd.mi;
    if ((td->mb).e_mbd.chroma_up_available == true) {
      pMVar41 = ppMVar17[(long)-iVar29 + (long)(int)(uVar65 - iVar30)];
    }
    else {
      pMVar41 = (MB_MODE_INFO *)0x0;
    }
    (td->mb).e_mbd.chroma_above_mbmi = pMVar41;
    if (bVar67 == false) {
      pMVar41 = (MB_MODE_INFO *)0x0;
    }
    else {
      pMVar41 = ppMVar17[(long)-iVar29 + (long)(int)(iVar30 * uVar32) + -1];
    }
    (td->mb).e_mbd.chroma_left_mbmi = pMVar41;
  }
LAB_0019c1a6:
  (td->mb).e_mbd.height = bVar39;
  (td->mb).e_mbd.width = bVar40;
  (td->mb).e_mbd.is_last_vertical_rect = false;
  if ((bVar40 < bVar39) && (((uint)bVar40 + mi_row & bVar39 - 1) == 0)) {
    (td->mb).e_mbd.is_last_vertical_rect = true;
  }
  (td->mb).e_mbd.is_first_horizontal_rect = false;
  if ((bVar39 < bVar40) && ((bVar40 - 1 & uVar59) == 0)) {
    (td->mb).e_mbd.is_first_horizontal_rect = true;
  }
  cm = &cpi->common;
  pMVar51 = &(td->mb).e_mbd;
  (td->mb).e_mbd.above_txfm_context = (cpi->common).above_contexts.txfm[tile->tile_row] + mi_row;
  (td->mb).e_mbd.left_txfm_context = (td->mb).e_mbd.left_txfm_context_buffer + (uVar59 & 0x1f);
  uVar65 = (uint)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  local_50 = cpi;
  local_38 = tok;
  if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
    psVar1 = &(cpi->common).seg;
    pMVar41 = *ppMVar2;
    xd_01 = pMVar51;
    if (((cpi->common).seg.segid_preskip != '\0') && ((cpi->common).seg.update_map != '\0')) {
      in_stack_fffffffffffffee8 = (MB_MODE_INFO *)((ulong)uVar65 << 0x20);
      write_segment_id(cpi,pMVar51,pMVar41,w,psVar1,&pFVar14->seg,0);
    }
    iVar30 = write_skip(cm,pMVar51,(byte)*(undefined2 *)&pMVar41->field_0xa7 & 7,pMVar41,w);
    if (((cpi->common).seg.segid_preskip == '\0') && ((cpi->common).seg.update_map != '\0')) {
      in_stack_fffffffffffffee8 =
           (MB_MODE_INFO *)CONCAT44((int)((ulong)in_stack_fffffffffffffee8 >> 0x20),iVar30);
      write_segment_id(cpi,pMVar51,pMVar41,w,psVar1,&pFVar14->seg,iVar30);
    }
    if (((cpi->common).features.coded_lossless == false) &&
       ((cpi->common).features.allow_intrabc == false)) {
      pSVar19 = (cpi->common).seq_params;
      uVar65 = (td->mb).e_mbd.mi_row;
      uVar32 = (td->mb).e_mbd.mi_col;
      if ((pSVar19->mib_size - 1U & (uVar32 | uVar65)) == 0) {
        (td->mb).e_mbd.cdef_transmitted[0] = false;
        (td->mb).e_mbd.cdef_transmitted[1] = false;
        (td->mb).e_mbd.cdef_transmitted[2] = false;
        (td->mb).e_mbd.cdef_transmitted[3] = false;
      }
      uVar49 = 0;
      if (pSVar19->sb_size == BLOCK_128X128) {
        uVar49 = (ulong)(uVar65 >> 3 & 2 | uVar32 >> 4 & 1);
      }
      if ((iVar30 == 0) && ((td->mb).e_mbd.cdef_transmitted[uVar49] == false)) {
        iVar29 = (cpi->common).cdef_info.cdef_bits;
        if (0 < iVar29) {
          sVar52 = *(short *)&(cpi->common).mi_params.mi_grid_base
                              [(int)((uVar65 & 0xfffffff0) * (cpi->common).mi_params.mi_stride +
                                    (uVar32 & 0xfffffff0))]->field_0xa7;
          pMVar34 = ((MB_MODE_INFO *)w)->ref_frame;
          iVar29 = iVar29 + 1;
          do {
            od_ec_encode_bool_q15
                      ((od_ec_enc *)pMVar34,
                       (uint)(((uint)((int)(short)(sVar52 * 2) >> 0xc) >> (iVar29 - 2U & 0x1f) & 1)
                             != 0),0x4000);
            iVar29 = iVar29 + -1;
          } while (1 < iVar29);
        }
        (td->mb).e_mbd.cdef_transmitted[uVar49] = true;
      }
    }
    write_delta_q_params(cm,xd_01,iVar30,w);
    pMVar69 = (MB_MODE_INFO *)w;
    if (((((cm->current_frame).frame_type & 0xfd) == 0) &&
        ((cpi->common).features.allow_screen_content_tools == true)) &&
       ((cpi->common).features.allow_intrabc != false)) {
      pMVar70 = *(td->mb).e_mbd.mi;
      uVar65 = *(ushort *)&pMVar70->field_0xa7 >> 7 & 1;
      pFVar18 = (td->mb).e_mbd.tile_ctx;
      od_ec_encode_cdf_q15
                ((od_ec_enc *)((MB_MODE_INFO *)w)->ref_frame,uVar65,pFVar18->intrabc_cdf,2);
      sVar52 = (short)uVar65;
      if ((char)(((MB_MODE_INFO *)w)->wm_params).wmmat[5] != '\0') {
        uVar28 = pFVar18->intrabc_cdf[2];
        bVar39 = (char)(uVar28 >> 4) + 4;
        uVar11 = pFVar18->intrabc_cdf[0];
        if (sVar52 == 0) {
          sVar24 = -(uVar11 >> (bVar39 & 0x1f));
        }
        else {
          sVar24 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar39 & 0x1f));
        }
        pFVar18->intrabc_cdf[0] = sVar24 + uVar11;
        pFVar18->intrabc_cdf[2] = uVar28 + (uVar28 < 0x20);
      }
      if (sVar52 != 0) {
        local_70 = CONCAT44(local_70._4_4_,pMVar20->ref_mv_stack[0].this_mv.as_int);
        av1_encode_dv((aom_writer *)pMVar69,&pMVar70->mv[0].as_mv,(MV *)&local_70,&pFVar18->ndvc);
      }
      pTVar47 = td;
      if ((pMVar41->field_0xa7 & 0x80) != 0) goto LAB_0019cbae;
    }
    iVar30 = 1;
LAB_0019cb9f:
    write_intra_prediction_modes(cm,xd_01,iVar30,(aom_writer *)pMVar69);
    pTVar47 = td;
  }
  else {
    bVar39 = (*ppMVar2)->ref_frame[0];
    bVar40 = (*ppMVar2)->ref_frame[1];
    iVar29 = -1;
    iVar30 = -1;
    if ((char)bVar39 < '\t') {
      bVar37 = 1;
      if ('\x01' < (char)bVar39) {
        bVar37 = bVar39;
      }
      iVar30 = (cpi->common).remapped_ref_idx[bVar37 - 1];
    }
    psVar45 = (scale_factors *)0x0;
    if (iVar30 != -1) {
      psVar45 = (cpi->common).ref_scale_factors + iVar30;
    }
    (td->mb).e_mbd.block_ref_scale_factors[0] = psVar45;
    if ((char)bVar40 < '\t') {
      bVar39 = 1;
      if ('\x01' < (char)bVar40) {
        bVar39 = bVar40;
      }
      iVar29 = (cpi->common).remapped_ref_idx[bVar39 - 1];
    }
    psVar45 = (scale_factors *)0x0;
    if (iVar29 != -1) {
      psVar45 = (cpi->common).ref_scale_factors + iVar29;
    }
    (td->mb).e_mbd.block_ref_scale_factors[1] = psVar45;
    psVar1 = &(cpi->common).seg;
    pMVar41 = *ppMVar2;
    bVar39 = pMVar41->field_0xa7;
    uVar32 = 1;
    if (-1 < (char)bVar39) {
      uVar32 = (uint)('\0' < pMVar41->ref_frame[0]);
    }
    BVar5 = pMVar41->bsize;
    bVar40 = pMVar41->mode;
    uVar59 = (uint)(cpi->common).features.allow_high_precision_mv;
    cVar58 = pMVar41->ref_frame[1];
    uVar49 = CONCAT44(uVar65,1);
    xd_00 = pMVar51;
    write_inter_segment_id(cpi,pMVar51,w,psVar1,&pFVar14->seg,0,1);
    pMVar70 = (MB_MODE_INFO *)w;
    if (((cpi->common).current_frame.skip_mode_info.skip_mode_flag != 0) &&
       ((psVar1->enabled == '\0' ||
        (((cpi->common).seg.feature_mask[(ulong)bVar39 & 7] & 0x40) == 0)))) {
      bVar37 = block_size_high[pMVar41->bsize];
      if (block_size_wide[pMVar41->bsize] < block_size_high[pMVar41->bsize]) {
        bVar37 = block_size_wide[pMVar41->bsize];
      }
      if ((7 < bVar37) &&
         ((psVar1->enabled == '\0' ||
          (((cpi->common).seg.feature_mask[(ulong)bVar39 & 7] & 0xa0) == 0)))) {
        pMVar69 = (td->mb).e_mbd.left_mbmi;
        pMVar71 = (td->mb).e_mbd.above_mbmi;
        if (pMVar71 == (MB_MODE_INFO *)0x0) {
          uVar46 = 0;
        }
        else {
          uVar46 = (ulong)(*(ushort *)&pMVar71->field_0xa7 >> 6 & 1);
        }
        uVar65 = *(ushort *)&pMVar41->field_0xa7 >> 6 & 1;
        if (pMVar69 == (MB_MODE_INFO *)0x0) {
          uVar35 = 0;
        }
        else {
          uVar35 = (ulong)(*(ushort *)&pMVar69->field_0xa7 >> 6 & 1);
        }
        lVar33 = uVar35 + uVar46;
        pFVar18 = (td->mb).e_mbd.tile_ctx;
        paaVar48 = pFVar18->skip_mode_cdfs + lVar33;
        pMVar51 = xd_00;
        od_ec_encode_cdf_q15((od_ec_enc *)((MB_MODE_INFO *)w)->ref_frame,uVar65,*paaVar48,2);
        xd_00 = pMVar51;
        if (*(char *)((((MB_MODE_INFO *)w)->wm_params).wmmat + 5) != '\0') {
          uVar28 = pFVar18->skip_mode_cdfs[lVar33][2];
          bVar37 = (char)(uVar28 >> 4) + 4;
          uVar11 = (*paaVar48)[0];
          if ((short)uVar65 == 0) {
            sVar52 = -(uVar11 >> (bVar37 & 0x1f));
          }
          else {
            sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar37 & 0x1f));
          }
          (*paaVar48)[0] = sVar52 + uVar11;
          pFVar18->skip_mode_cdfs[lVar33][2] = uVar28 + (uVar28 < 0x20);
        }
      }
    }
    iVar30 = 1;
    if ((pMVar41->field_0xa7 & 0x40) == 0) {
      iVar30 = write_skip(cm,pMVar51,bVar39 & 7,pMVar41,(aom_writer *)pMVar70);
    }
    in_stack_fffffffffffffee8 = (MB_MODE_INFO *)(uVar49 & 0xffffffff00000000);
    write_inter_segment_id(cpi,pMVar51,(aom_writer *)pMVar70,psVar1,&pFVar14->seg,iVar30,0);
    if (((cpi->common).features.coded_lossless == false) &&
       ((cpi->common).features.allow_intrabc == false)) {
      pSVar19 = (cpi->common).seq_params;
      uVar65 = (td->mb).e_mbd.mi_row;
      uVar62 = (td->mb).e_mbd.mi_col;
      if ((pSVar19->mib_size - 1U & (uVar62 | uVar65)) == 0) {
        (td->mb).e_mbd.cdef_transmitted[0] = false;
        (td->mb).e_mbd.cdef_transmitted[1] = false;
        (td->mb).e_mbd.cdef_transmitted[2] = false;
        (td->mb).e_mbd.cdef_transmitted[3] = false;
      }
      uVar49 = 0;
      if (pSVar19->sb_size == BLOCK_128X128) {
        uVar49 = (ulong)(uVar65 >> 3 & 2 | uVar62 >> 4 & 1);
      }
      if ((iVar30 == 0) && ((td->mb).e_mbd.cdef_transmitted[uVar49] == false)) {
        iVar29 = (cpi->common).cdef_info.cdef_bits;
        if (0 < iVar29) {
          sVar52 = *(short *)&(cpi->common).mi_params.mi_grid_base
                              [(int)((uVar65 & 0xfffffff0) * (cpi->common).mi_params.mi_stride +
                                    (uVar62 & 0xfffffff0))]->field_0xa7;
          pMVar34 = pMVar70->ref_frame;
          iVar29 = iVar29 + 1;
          do {
            od_ec_encode_bool_q15
                      ((od_ec_enc *)pMVar34,
                       (uint)(((uint)((int)(short)(sVar52 * 2) >> 0xc) >> (iVar29 - 2U & 0x1f) & 1)
                             != 0),0x4000);
            iVar29 = iVar29 + -1;
          } while (1 < iVar29);
        }
        (td->mb).e_mbd.cdef_transmitted[uVar49] = true;
      }
    }
    xd_01 = xd_00;
    write_delta_q_params(cm,xd_00,iVar30,(aom_writer *)pMVar70);
    pMVar69 = pMVar70;
    if (((*(ushort *)&pMVar41->field_0xa7 & 0x40) == 0) &&
       ((psVar1->enabled == '\0' ||
        (((cpi->common).seg.feature_mask[*(ushort *)&pMVar41->field_0xa7 & 7] & 0xa0) == 0)))) {
      iVar30 = av1_get_intra_inter_context(xd_00);
      paaVar48 = ((td->mb).e_mbd.tile_ctx)->intra_inter_cdf + iVar30;
      pMVar69 = pMVar70;
      od_ec_encode_cdf_q15((od_ec_enc *)pMVar70->ref_frame,uVar32,*paaVar48,2);
      if ((char)(pMVar70->wm_params).wmmat[5] != '\0') {
        uVar28 = (*paaVar48)[2];
        bVar37 = (char)(uVar28 >> 4) + 4;
        uVar11 = (*paaVar48)[0];
        if (uVar32 == 0) {
          sVar52 = -(uVar11 >> (bVar37 & 0x1f));
        }
        else {
          sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar37 & 0x1f));
        }
        (*paaVar48)[0] = sVar52 + uVar11;
        (*paaVar48)[2] = uVar28 + (uVar28 < 0x20);
      }
    }
    pTVar47 = td;
    if ((pMVar41->field_0xa7 & 0x40) == 0) {
      if (uVar32 == 0) {
        iVar30 = 0;
        goto LAB_0019cb9f;
      }
      (td->mb).e_mbd.neighbors_ref_counts[0] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[1] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[2] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[3] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[4] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[5] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[6] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[7] = '\0';
      bVar67 = (td->mb).e_mbd.left_available;
      if (((td->mb).e_mbd.up_available == true) &&
         ((pMVar70 = (td->mb).e_mbd.above_mbmi, (pMVar70->field_0xa7 & 0x80) != 0 ||
          ('\0' < pMVar70->ref_frame[0])))) {
        puVar3 = (td->mb).e_mbd.neighbors_ref_counts + pMVar70->ref_frame[0];
        *puVar3 = *puVar3 + '\x01';
        if (0 < (long)pMVar70->ref_frame[1]) {
          puVar3 = (td->mb).e_mbd.neighbors_ref_counts + pMVar70->ref_frame[1];
          *puVar3 = *puVar3 + '\x01';
        }
      }
      if ((bVar67 != false) &&
         ((pMVar70 = (td->mb).e_mbd.left_mbmi, (pMVar70->field_0xa7 & 0x80) != 0 ||
          ('\0' < pMVar70->ref_frame[0])))) {
        puVar3 = (td->mb).e_mbd.neighbors_ref_counts + pMVar70->ref_frame[0];
        *puVar3 = *puVar3 + '\x01';
        if (0 < (long)pMVar70->ref_frame[1]) {
          puVar3 = (td->mb).e_mbd.neighbors_ref_counts + pMVar70->ref_frame[1];
          *puVar3 = *puVar3 + '\x01';
        }
      }
      pMVar70 = *(td->mb).e_mbd.mi;
      cVar56 = pMVar70->ref_frame[1];
      if ((psVar1->enabled == '\0') ||
         (((cpi->common).seg.feature_mask[*(ushort *)&pMVar70->field_0xa7 & 7] & 0xe0) == 0)) {
        pMVar71 = pMVar69;
        if ((cpi->common).current_frame.reference_mode == '\x02') {
          bVar37 = block_size_high[pMVar70->bsize];
          if (block_size_wide[pMVar70->bsize] < block_size_high[pMVar70->bsize]) {
            bVar37 = block_size_wide[pMVar70->bsize];
          }
          if (7 < bVar37) {
            pFVar18 = (td->mb).e_mbd.tile_ctx;
            iVar30 = av1_get_reference_mode_context(xd_01);
            paaVar48 = pFVar18->comp_inter_cdf + iVar30;
            pMVar71 = pMVar69;
            od_ec_encode_cdf_q15((od_ec_enc *)pMVar69->ref_frame,(uint)('\0' < cVar56),*paaVar48,2);
            if ((char)(pMVar69->wm_params).wmmat[5] != '\0') {
              uVar28 = pFVar18->comp_inter_cdf[iVar30][2];
              bVar37 = (char)(uVar28 >> 4) + 4;
              uVar11 = (*paaVar48)[0];
              if (cVar56 < '\x01') {
                sVar52 = -(uVar11 >> (bVar37 & 0x1f));
              }
              else {
                sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar37 & 0x1f));
              }
              (*paaVar48)[0] = sVar52 + uVar11;
              pFVar18->comp_inter_cdf[iVar30][2] = uVar28 + (uVar28 < 0x20);
            }
          }
        }
        if (cVar56 < '\x01') {
          bVar37 = pMVar70->ref_frame[0] - 5;
          pFVar18 = (td->mb).e_mbd.tile_ctx;
          iVar30 = av1_get_pred_context_single_ref_p1(xd_01);
          icdf_01 = pFVar18->single_ref_cdf + iVar30;
          pMVar34 = pMVar71->ref_frame;
          pMVar69 = pMVar71;
          od_ec_encode_cdf_q15((od_ec_enc *)pMVar34,(uint)(bVar37 < 3),(uint16_t *)icdf_01,2);
          if ((char)(pMVar71->wm_params).wmmat[5] != '\0') {
            uVar28 = pFVar18->single_ref_cdf[iVar30][0][2];
            bVar38 = (char)(uVar28 >> 4) + 4;
            uVar11 = (*icdf_01)[0][0];
            if (bVar37 < 3) {
              sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar38 & 0x1f));
            }
            else {
              sVar52 = -(uVar11 >> (bVar38 & 0x1f));
            }
            (*icdf_01)[0][0] = sVar52 + uVar11;
            pFVar18->single_ref_cdf[iVar30][0][2] = uVar28 + (uVar28 < 0x20);
          }
          cVar56 = pMVar70->ref_frame[0];
          if (bVar37 < 3) {
            pFVar18 = (td->mb).e_mbd.tile_ctx;
            iVar30 = av1_get_pred_context_single_ref_p2(xd_01);
            paaVar48 = pFVar18->single_ref_cdf[iVar30] + 1;
            od_ec_encode_cdf_q15((od_ec_enc *)pMVar34,(uint)(cVar56 == '\a'),*paaVar48,2);
            if ((char)(pMVar69->wm_params).wmmat[5] != '\0') {
              uVar28 = pFVar18->single_ref_cdf[iVar30][1][2];
              bVar37 = (char)(uVar28 >> 4) + 4;
              uVar11 = (*paaVar48)[0];
              if (cVar56 == '\a') {
                sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar37 & 0x1f));
              }
              else {
                sVar52 = -(uVar11 >> (bVar37 & 0x1f));
              }
              (*paaVar48)[0] = sVar52 + uVar11;
              pFVar18->single_ref_cdf[iVar30][1][2] = uVar28 + (uVar28 < 0x20);
            }
            if (cVar56 != '\a') {
              bVar67 = pMVar70->ref_frame[0] == '\x06';
              pFVar18 = (td->mb).e_mbd.tile_ctx;
              iVar30 = av1_get_pred_context_single_ref_p6(xd_01);
              paaVar48 = pFVar18->single_ref_cdf[iVar30] + 5;
LAB_0019dd4f:
              aom_write_symbol((aom_writer *)pMVar69,(uint)bVar67,*paaVar48,2);
            }
          }
          else {
            bVar37 = cVar56 - 3;
            pFVar18 = (td->mb).e_mbd.tile_ctx;
            iVar30 = av1_get_pred_context_single_ref_p3(xd_01);
            paaVar48 = pFVar18->single_ref_cdf[iVar30] + 2;
            od_ec_encode_cdf_q15((od_ec_enc *)pMVar34,(uint)(bVar37 < 2),*paaVar48,2);
            if ((char)(pMVar69->wm_params).wmmat[5] != '\0') {
              uVar28 = pFVar18->single_ref_cdf[iVar30][2][2];
              bVar38 = (char)(uVar28 >> 4) + 4;
              uVar11 = (*paaVar48)[0];
              if (bVar37 < 2) {
                sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar38 & 0x1f));
              }
              else {
                sVar52 = -(uVar11 >> (bVar38 & 0x1f));
              }
              (*paaVar48)[0] = sVar52 + uVar11;
              pFVar18->single_ref_cdf[iVar30][2][2] = uVar28 + (uVar28 < 0x20);
            }
            pFVar18 = (td->mb).e_mbd.tile_ctx;
            if (bVar37 < 2) {
              bVar67 = pMVar70->ref_frame[0] != '\x03';
              iVar30 = av1_get_pred_context_single_ref_p5(xd_01);
              paaVar48 = pFVar18->single_ref_cdf[iVar30] + 4;
            }
            else {
              bVar67 = pMVar70->ref_frame[0] != '\x01';
              iVar30 = av1_get_pred_context_single_ref_p4(xd_01);
              paaVar48 = pFVar18->single_ref_cdf[iVar30] + 3;
            }
            aom_write_symbol((aom_writer *)pMVar69,(uint)bVar67,*paaVar48,2);
          }
        }
        else {
          if (pMVar70->ref_frame[1] < '\x01') {
            uVar65 = 0;
          }
          else {
            uVar65 = (uint)(pMVar70->ref_frame[1] < '\x05' != '\x04' < pMVar70->ref_frame[0]);
          }
          iVar30 = av1_get_comp_reference_type_context(xd_01);
          paaVar48 = ((td->mb).e_mbd.tile_ctx)->comp_ref_type_cdf + iVar30;
          pMVar34 = pMVar71->ref_frame;
          pMVar69 = pMVar71;
          od_ec_encode_cdf_q15((od_ec_enc *)pMVar34,uVar65 ^ 1,*paaVar48,2);
          if ((char)(pMVar71->wm_params).wmmat[5] != '\0') {
            uVar28 = (*paaVar48)[2];
            bVar37 = (char)(uVar28 >> 4) + 4;
            uVar11 = (*paaVar48)[0];
            if (uVar65 == 0) {
              sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar37 & 0x1f));
            }
            else {
              sVar52 = -(uVar11 >> (bVar37 & 0x1f));
            }
            (*paaVar48)[0] = uVar11 + sVar52;
            (*paaVar48)[2] = uVar28 + (uVar28 < 0x20);
          }
          cVar56 = pMVar70->ref_frame[0];
          if (uVar65 == 0) {
            bVar37 = cVar56 - 3;
            iVar30 = av1_get_pred_context_comp_ref_p(xd_01);
            paaaVar4 = ((td->mb).e_mbd.tile_ctx)->comp_ref_cdf + iVar30;
            od_ec_encode_cdf_q15((od_ec_enc *)pMVar34,(uint)(bVar37 < 2),(uint16_t *)paaaVar4,2);
            if ((char)(pMVar69->wm_params).wmmat[5] != '\0') {
              uVar28 = (*paaaVar4)[0][2];
              bVar38 = (char)(uVar28 >> 4) + 4;
              uVar11 = (*paaaVar4)[0][0];
              if (bVar37 < 2) {
                sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar38 & 0x1f));
              }
              else {
                sVar52 = -(uVar11 >> (bVar38 & 0x1f));
              }
              (*paaaVar4)[0][0] = sVar52 + uVar11;
              (*paaaVar4)[0][2] = uVar28 + (uVar28 < 0x20);
            }
            cVar56 = pMVar70->ref_frame[0];
            if (bVar37 < 2) {
              iVar30 = av1_get_pred_context_comp_ref_p2(xd_01);
              paaVar26 = ((td->mb).e_mbd.tile_ctx)->comp_ref_cdf[iVar30];
              paaVar48 = paaVar26 + 2;
              od_ec_encode_cdf_q15((od_ec_enc *)pMVar34,(uint)(cVar56 == '\x04'),*paaVar48,2);
              if ((char)(pMVar69->wm_params).wmmat[5] != '\0') {
                uVar28 = paaVar26[2][2];
                bVar37 = (char)(uVar28 >> 4) + 4;
                uVar11 = (*paaVar48)[0];
                if (cVar56 != '\x04') goto LAB_0019dad0;
LAB_0019db41:
                uVar44 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar37 & 0x1f)) + uVar11;
LAB_0019db4c:
                (*paaVar48)[0] = uVar44;
                (*paaVar48)[2] = uVar28 + (uVar28 < 0x20);
              }
            }
            else {
              iVar30 = av1_get_pred_context_comp_ref_p1(xd_01);
              paaVar26 = ((td->mb).e_mbd.tile_ctx)->comp_ref_cdf[iVar30];
              paaVar48 = paaVar26 + 1;
              od_ec_encode_cdf_q15((od_ec_enc *)pMVar34,(uint)(cVar56 == '\x02'),*paaVar48,2);
              if ((char)(pMVar69->wm_params).wmmat[5] != '\0') {
                uVar28 = paaVar26[1][2];
                bVar37 = (char)(uVar28 >> 4) + 4;
                uVar11 = (*paaVar48)[0];
                if (cVar56 == '\x02') goto LAB_0019db41;
LAB_0019dad0:
                uVar44 = uVar11 - (uVar11 >> (bVar37 & 0x1f));
                goto LAB_0019db4c;
              }
            }
            cVar56 = pMVar70->ref_frame[1];
            iVar30 = av1_get_pred_context_comp_bwdref_p(xd_01);
            icdf_00 = ((td->mb).e_mbd.tile_ctx)->comp_bwdref_cdf + iVar30;
            od_ec_encode_cdf_q15((od_ec_enc *)pMVar34,(uint)(cVar56 == '\a'),(uint16_t *)icdf_00,2);
            if ((char)(pMVar69->wm_params).wmmat[5] != '\0') {
              uVar28 = (*icdf_00)[0][2];
              bVar37 = (char)(uVar28 >> 4) + 4;
              uVar11 = (*icdf_00)[0][0];
              if (cVar56 == '\a') {
                sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar37 & 0x1f));
              }
              else {
                sVar52 = -(uVar11 >> (bVar37 & 0x1f));
              }
              (*icdf_00)[0][0] = sVar52 + uVar11;
              (*icdf_00)[0][2] = uVar28 + (uVar28 < 0x20);
            }
            if (cVar56 != '\a') {
              cVar56 = pMVar70->ref_frame[1];
              iVar30 = av1_get_pred_context_comp_bwdref_p1(xd_01);
              paaVar26 = ((td->mb).e_mbd.tile_ctx)->comp_bwdref_cdf[iVar30];
              paaVar48 = paaVar26 + 1;
              od_ec_encode_cdf_q15((od_ec_enc *)pMVar34,(uint)(cVar56 == '\x06'),*paaVar48,2);
              if ((char)(pMVar69->wm_params).wmmat[5] != '\0') {
                uVar28 = paaVar26[1][2];
                bVar37 = (char)(uVar28 >> 4) + 4;
                uVar11 = (*paaVar48)[0];
                if (cVar56 == '\x06') {
                  sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar37 & 0x1f));
                }
                else {
                  sVar52 = -(uVar11 >> (bVar37 & 0x1f));
                }
                (*paaVar48)[0] = sVar52 + uVar11;
                paaVar26[1][2] = uVar28 + (uVar28 < 0x20);
              }
            }
          }
          else {
            iVar30 = av1_get_pred_context_uni_comp_ref_p(xd_01);
            paaaVar4 = ((td->mb).e_mbd.tile_ctx)->uni_comp_ref_cdf + iVar30;
            od_ec_encode_cdf_q15
                      ((od_ec_enc *)pMVar34,(uint)(cVar56 == '\x05'),(uint16_t *)paaaVar4,2);
            if ((char)(pMVar69->wm_params).wmmat[5] != '\0') {
              uVar28 = (*paaaVar4)[0][2];
              bVar37 = (char)(uVar28 >> 4) + 4;
              uVar11 = (*paaaVar4)[0][0];
              if (cVar56 == '\x05') {
                sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar37 & 0x1f));
              }
              else {
                sVar52 = -(uVar11 >> (bVar37 & 0x1f));
              }
              (*paaaVar4)[0][0] = sVar52 + uVar11;
              (*paaaVar4)[0][2] = uVar28 + (uVar28 < 0x20);
            }
            if (cVar56 != '\x05') {
              bVar37 = pMVar70->ref_frame[1] - 3;
              pTVar47 = td;
              iVar30 = av1_get_pred_context_uni_comp_ref_p1(xd_01);
              pFVar18 = (td->mb).e_mbd.tile_ctx;
              paaVar48 = pFVar18->uni_comp_ref_cdf[iVar30] + 1;
              od_ec_encode_cdf_q15((od_ec_enc *)pMVar34,(uint)(bVar37 < 2),*paaVar48,2);
              if ((char)(pMVar69->wm_params).wmmat[5] != '\0') {
                uVar28 = pFVar18->uni_comp_ref_cdf[iVar30][1][2];
                bVar38 = (char)(uVar28 >> 4) + 4;
                uVar11 = (*paaVar48)[0];
                if (bVar37 < 2) {
                  sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar38 & 0x1f));
                }
                else {
                  sVar52 = -(uVar11 >> (bVar38 & 0x1f));
                }
                (*paaVar48)[0] = sVar52 + uVar11;
                pFVar18->uni_comp_ref_cdf[iVar30][1][2] = uVar28 + (uVar28 < 0x20);
              }
              td = pTVar47;
              if (bVar37 < 2) {
                bVar67 = pMVar70->ref_frame[1] == '\x04';
                iVar30 = av1_get_pred_context_uni_comp_ref_p2(xd_01);
                paaVar48 = ((pTVar47->mb).e_mbd.tile_ctx)->uni_comp_ref_cdf[iVar30] + 2;
                td = pTVar47;
                goto LAB_0019dd4f;
              }
            }
          }
        }
      }
      uVar28 = pMVar20->mode_context;
      if ('\0' < pMVar41->ref_frame[1]) {
        uVar49 = 4;
        if ((ushort)(uVar28 & 7) < 4) {
          uVar49 = (ulong)(uVar28 & 7);
        }
        uVar28 = compound_mode_ctx_map[uVar28 >> 5 & 7][uVar49];
      }
      uVar65 = (uint)bVar40;
      if ((psVar1->enabled == '\0') ||
         (pTVar47 = td, ((cpi->common).seg.feature_mask[bVar39 & 7] & 0x40) == 0)) {
        bVar39 = (byte)(uVar65 - 0x11);
        if (bVar39 < 8) {
          uVar32 = uVar65 - 0x11 & 0xff;
          pFVar18 = (td->mb).e_mbd.tile_ctx;
          icdf_02 = pFVar18->inter_compound_mode_cdf + (short)uVar28;
          pMVar70 = pMVar69;
          od_ec_encode_cdf_q15((od_ec_enc *)pMVar69->ref_frame,uVar32,*icdf_02,8);
          pWVar25 = &pMVar69->wm_params;
          pMVar69 = pMVar70;
          if ((char)pWVar25->wmmat[5] != '\0') {
            uVar11 = pFVar18->inter_compound_mode_cdf[(short)uVar28][8];
            bVar39 = (char)(uVar11 >> 4) + 5;
            uVar49 = 0;
            do {
              uVar12 = (*icdf_02)[uVar49];
              if (uVar49 < uVar32) {
                sVar52 = (short)((int)(0x8000 - (uint)uVar12) >> (bVar39 & 0x1f));
              }
              else {
                sVar52 = -(uVar12 >> (bVar39 & 0x1f));
              }
              (*icdf_02)[uVar49] = sVar52 + uVar12;
              uVar49 = uVar49 + 1;
            } while (uVar49 != 7);
            paVar54 = pFVar18->inter_compound_mode_cdf[(short)uVar28] + 8;
            *paVar54 = *paVar54 + (ushort)(uVar11 < 0x20);
          }
        }
        else if (0xfb < bVar39) {
          paaVar48 = pFVar14->newmv_cdf + (uVar28 & 7);
          pMVar34 = pMVar69->ref_frame;
          pMVar70 = pMVar69;
          od_ec_encode_cdf_q15((od_ec_enc *)pMVar34,(uint)(uVar65 != 0x10),*paaVar48,2);
          if ((char)(pMVar69->wm_params).wmmat[5] != '\0') {
            uVar11 = (*paaVar48)[2];
            bVar39 = (char)(uVar11 >> 4) + 4;
            uVar12 = (*paaVar48)[0];
            if (uVar65 == 0x10) {
              sVar52 = -(uVar12 >> (bVar39 & 0x1f));
            }
            else {
              sVar52 = (short)((int)(0x8000 - (uint)uVar12) >> (bVar39 & 0x1f));
            }
            (*paaVar48)[0] = sVar52 + uVar12;
            (*paaVar48)[2] = uVar11 + (uVar11 < 0x20);
          }
          pMVar69 = pMVar70;
          if (uVar65 != 0x10) {
            paaVar48 = pFVar14->zeromv_cdf + (uVar28 >> 3 & 1);
            od_ec_encode_cdf_q15((od_ec_enc *)pMVar34,(uint)(uVar65 != 0xf),*paaVar48,2);
            if ((char)(pMVar70->wm_params).wmmat[5] != '\0') {
              uVar11 = (*paaVar48)[2];
              bVar39 = (char)(uVar11 >> 4) + 4;
              uVar12 = (*paaVar48)[0];
              if (uVar65 == 0xf) {
                sVar52 = -(uVar12 >> (bVar39 & 0x1f));
              }
              else {
                sVar52 = (short)((int)(0x8000 - (uint)uVar12) >> (bVar39 & 0x1f));
              }
              (*paaVar48)[0] = sVar52 + uVar12;
              (*paaVar48)[2] = uVar11 + (uVar11 < 0x20);
            }
            pMVar69 = pMVar70;
            if (uVar65 != 0xf) {
              paaVar48 = pFVar14->refmv_cdf + (uVar28 >> 4 & 0xf);
              od_ec_encode_cdf_q15((od_ec_enc *)pMVar34,(uint)(uVar65 != 0xd),*paaVar48,2);
              pMVar69 = pMVar70;
              if ((char)(pMVar70->wm_params).wmmat[5] != '\0') {
                uVar28 = (*paaVar48)[2];
                bVar39 = (char)(uVar28 >> 4) + 4;
                uVar11 = (*paaVar48)[0];
                if (uVar65 == 0xd) {
                  sVar52 = -(uVar11 >> (bVar39 & 0x1f));
                }
                else {
                  sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar39 & 0x1f));
                }
                (*paaVar48)[0] = sVar52 + uVar11;
                (*paaVar48)[2] = uVar28 + (uVar28 < 0x20);
              }
            }
          }
        }
        pmVar27 = local_40;
        pTVar47 = td;
        if (((bVar40 & 0xf7) == 0x10) ||
           ((uVar65 < 0x17 && ((0x644000U >> (uVar65 & 0x1f) & 1) != 0)))) {
          bVar39 = pMVar41->mode;
          if (bVar39 < 0x19) {
            if ((0x644000U >> (bVar39 & 0x1f) & 1) == 0) {
              if ((0x1010000U >> (bVar39 & 0x1f) & 1) != 0) {
                pMVar34 = pMVar69->ref_frame;
                uVar49 = 0;
                do {
                  while (uVar46 = uVar49 + 1, uVar46 < pMVar20->ref_mv_count) {
                    bVar67 = pMVar20->weight[uVar49 + 1] < 0x280;
                    uVar35 = (ulong)bVar67;
                    if (pMVar20->weight[uVar49] < 0x280) {
                      uVar35 = (ulong)((uint)bVar67 * 2);
                    }
                    uVar63 = (ulong)(*(ushort *)&pMVar41->field_0xa7 >> 4 & 3);
                    paaVar48 = pFVar14->drl_cdf + uVar35;
                    td = pTVar47;
                    od_ec_encode_cdf_q15((od_ec_enc *)pMVar34,(uint)(uVar49 != uVar63),*paaVar48,2);
                    if ((char)(pMVar69->wm_params).wmmat[5] != '\0') {
                      uVar28 = (*paaVar48)[2];
                      bVar39 = (char)(uVar28 >> 4) + 4;
                      uVar11 = (*paaVar48)[0];
                      if (uVar49 == uVar63) {
                        sVar52 = -(uVar11 >> (bVar39 & 0x1f));
                      }
                      else {
                        sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar39 & 0x1f));
                      }
                      (*paaVar48)[0] = sVar52 + uVar11;
                      (*paaVar48)[2] = uVar28 + (uVar28 < 0x20);
                    }
                    pTVar47 = td;
                    if ((uVar49 != 0) ||
                       (uVar49 = uVar46, (*(ushort *)&pMVar41->field_0xa7 & 0x30) == 0))
                    goto LAB_0019e35d;
                  }
                  bVar67 = uVar49 == 0;
                  uVar49 = uVar46;
                } while (bVar67);
              }
            }
            else {
              pMVar34 = pMVar69->ref_frame;
              uVar49 = 0;
              do {
                while (uVar46 = uVar49 + 1, uVar49 + 2 < (ulong)pMVar20->ref_mv_count) {
                  bVar67 = *(ushort *)((long)pMVar15->weight + uVar49 * 2 + (long)pmVar27 + 4) <
                           0x280;
                  uVar35 = (ulong)bVar67;
                  if (*(ushort *)((long)pMVar15->weight + uVar49 * 2 + (long)pmVar27 + 2) < 0x280) {
                    uVar35 = (ulong)((uint)bVar67 * 2);
                  }
                  uVar63 = (ulong)(*(ushort *)&pMVar41->field_0xa7 >> 4 & 3);
                  paaVar48 = pFVar14->drl_cdf + uVar35;
                  td = pTVar47;
                  od_ec_encode_cdf_q15((od_ec_enc *)pMVar34,(uint)(uVar49 != uVar63),*paaVar48,2);
                  if ((char)(pMVar69->wm_params).wmmat[5] != '\0') {
                    uVar28 = (*paaVar48)[2];
                    bVar39 = (char)(uVar28 >> 4) + 4;
                    uVar11 = (*paaVar48)[0];
                    if (uVar49 == uVar63) {
                      sVar52 = -(uVar11 >> (bVar39 & 0x1f));
                    }
                    else {
                      sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar39 & 0x1f));
                    }
                    (*paaVar48)[0] = sVar52 + uVar11;
                    (*paaVar48)[2] = uVar28 + (uVar28 < 0x20);
                  }
                  pTVar47 = td;
                  if ((1 < uVar46) ||
                     (bVar67 = uVar49 == (*(ushort *)&pMVar41->field_0xa7 >> 4 & 3), uVar49 = uVar46
                     , bVar67)) goto LAB_0019e35d;
                }
                uVar49 = uVar46;
              } while (uVar46 < 2);
            }
          }
        }
      }
LAB_0019e35d:
      if ((bVar40 & 0xf7) == 0x10) {
        lVar33 = 0;
        do {
          pMVar70 = *(td->mb).e_mbd.mi;
          cVar56 = pMVar70->ref_frame[0];
          uVar65 = (*(ushort *)&pMVar70->field_0xa7 >> 4 & 3) +
                   (uint)((byte)(pMVar70->mode - 0x15) < 2);
          cVar57 = pMVar70->ref_frame[1];
          if ('\0' < cVar57) {
            cVar55 = -1;
            if (cVar57 < '\x05' || '\x04' < cVar56) {
              lVar60 = 0;
              do {
                if ((cVar56 == (&comp_ref0_lut)[lVar60]) && (cVar57 == (&comp_ref1_lut)[lVar60])) {
                  cVar55 = (char)lVar60;
                  break;
                }
                lVar60 = lVar60 + 1;
              } while (lVar60 != 9);
            }
            if (cVar55 < '\0') {
              cVar56 = cVar57 * '\x04' + cVar56 + -0xd;
            }
            else {
              cVar56 = cVar55 + '\x14';
            }
          }
          pMVar20 = (td->mb).mbmi_ext_frame;
          if (cVar57 < '\x01') {
            piVar36 = pMVar20->global_mvs + cVar56;
            if (uVar65 < pMVar20->ref_mv_count) {
              piVar36 = &pMVar20->ref_mv_stack[uVar65].this_mv;
            }
          }
          else {
            piVar36 = &pMVar20->ref_mv_stack[uVar65].comp_mv;
            if (lVar33 == 0) {
              piVar36 = &pMVar20->ref_mv_stack[uVar65].this_mv;
            }
          }
          local_70 = CONCAT44(local_70._4_4_,piVar36->as_int);
          in_stack_fffffffffffffee8 =
               (MB_MODE_INFO *)CONCAT44((int)((ulong)in_stack_fffffffffffffee8 >> 0x20),uVar59);
          av1_encode_mv(cpi,(aom_writer *)pMVar69,td,(MV *)(pMVar41->mv + lVar33),(MV *)&local_70,
                        &pFVar14->nmvc,uVar59);
          td = pTVar47;
          pTVar47 = td;
        } while (('\0' < cVar58) && (bVar67 = lVar33 == 0, lVar33 = lVar33 + 1, bVar67));
      }
      else {
        if ((uVar65 == 0x15) || (uVar65 == 0x13)) {
          pMVar70 = *(td->mb).e_mbd.mi;
          cVar58 = pMVar70->ref_frame[0];
          uVar65 = (*(ushort *)&pMVar70->field_0xa7 >> 4 & 3) +
                   (uint)((byte)(pMVar70->mode - 0x15) < 2);
          cVar56 = pMVar70->ref_frame[1];
          if ('\0' < cVar56) {
            cVar57 = -1;
            if (cVar56 < '\x05' || '\x04' < cVar58) {
              lVar33 = 0;
              do {
                if ((cVar58 == (&comp_ref0_lut)[lVar33]) && (cVar56 == (&comp_ref1_lut)[lVar33])) {
                  cVar57 = (char)lVar33;
                  break;
                }
                lVar33 = lVar33 + 1;
              } while (lVar33 != 9);
            }
            if (cVar57 < '\0') {
              cVar58 = cVar56 * '\x04' + cVar58 + -0xd;
            }
            else {
              cVar58 = cVar57 + '\x14';
            }
          }
          pMVar20 = (td->mb).mbmi_ext_frame;
          if (cVar56 < '\x01') {
            piVar36 = pMVar20->global_mvs + cVar58;
            if (uVar65 < pMVar20->ref_mv_count) {
              piVar36 = &pMVar20->ref_mv_stack[uVar65].this_mv;
            }
          }
          else {
            piVar36 = &pMVar20->ref_mv_stack[uVar65].comp_mv;
          }
          uVar13 = piVar36->as_int;
          mv = (MV *)(pMVar41->mv + 1);
        }
        else {
          if ((bVar40 & 0xfd) != 0x14) goto LAB_0019e63f;
          pMVar70 = *(td->mb).e_mbd.mi;
          cVar58 = pMVar70->ref_frame[0];
          uVar65 = (*(ushort *)&pMVar70->field_0xa7 >> 4 & 3) +
                   (uint)((byte)(pMVar70->mode - 0x15) < 2);
          cVar56 = pMVar70->ref_frame[1];
          if ('\0' < cVar56) {
            cVar57 = -1;
            if (cVar56 < '\x05' || '\x04' < cVar58) {
              lVar33 = 0;
              do {
                if ((cVar58 == (&comp_ref0_lut)[lVar33]) && (cVar56 == (&comp_ref1_lut)[lVar33])) {
                  cVar57 = (char)lVar33;
                  break;
                }
                lVar33 = lVar33 + 1;
              } while (lVar33 != 9);
            }
            if (cVar57 < '\0') {
              cVar58 = cVar56 * '\x04' + cVar58 + -0xd;
            }
            else {
              cVar58 = cVar57 + '\x14';
            }
          }
          pMVar20 = (td->mb).mbmi_ext_frame;
          if (cVar56 < '\x01') {
            piVar36 = pMVar20->global_mvs + cVar58;
            if (uVar65 < pMVar20->ref_mv_count) {
              piVar36 = &pMVar20->ref_mv_stack[uVar65].this_mv;
            }
          }
          else {
            piVar36 = &pMVar20->ref_mv_stack[uVar65].this_mv;
          }
          uVar13 = piVar36->as_int;
          mv = (MV *)pMVar41->mv;
        }
        local_70 = CONCAT44(local_70._4_4_,uVar13);
        in_stack_fffffffffffffee8 =
             (MB_MODE_INFO *)CONCAT44((int)((ulong)in_stack_fffffffffffffee8 >> 0x20),uVar59);
        av1_encode_mv(cpi,(aom_writer *)pMVar69,td,mv,(MV *)&local_70,&pFVar14->nmvc,uVar59);
        td = pTVar47;
        pTVar47 = td;
      }
LAB_0019e63f:
      pMVar70 = pMVar69;
      if (((cpi->common).current_frame.reference_mode != '\x01') &&
         ((((((cpi->common).seq_params)->enable_interintra_compound != '\0' &&
            (0xf8 < (byte)(pMVar41->bsize - BLOCK_32X64))) && (0xfb < (byte)(pMVar41->mode - 0x11)))
          && ('\0' < pMVar41->ref_frame[0])))) {
        cVar58 = pMVar41->ref_frame[1];
        if (cVar58 < '\x01') {
          bVar39 = ""[BVar5];
          paaVar48 = pFVar14->interintra_cdf + bVar39;
          td = pTVar47;
          od_ec_encode_cdf_q15((od_ec_enc *)pMVar69->ref_frame,(uint)(cVar58 == '\0'),*paaVar48,2);
          if ((char)(pMVar69->wm_params).wmmat[5] != '\0') {
            uVar28 = (*paaVar48)[2];
            bVar40 = (char)(uVar28 >> 4) + 4;
            uVar11 = (*paaVar48)[0];
            if (cVar58 == '\0') {
              sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar40 & 0x1f));
            }
            else {
              sVar52 = -(uVar11 >> (bVar40 & 0x1f));
            }
            (*paaVar48)[0] = uVar11 + sVar52;
            (*paaVar48)[2] = uVar28 + (uVar28 < 0x20);
          }
          pTVar47 = td;
          if (cVar58 == '\0') {
            bVar40 = pMVar41->interintra_mode;
            icdf_03 = pFVar14->interintra_mode_cdf + bVar39;
            od_ec_encode_cdf_q15((od_ec_enc *)pMVar69->ref_frame,(uint)bVar40,*icdf_03,4);
            if ((char)(pMVar70->wm_params).wmmat[5] != '\0') {
              uVar28 = pFVar14->interintra_mode_cdf[bVar39][4];
              bVar37 = (char)(uVar28 >> 4) + 5;
              lVar33 = 0;
              do {
                uVar11 = (*icdf_03)[lVar33];
                if (lVar33 < (char)bVar40) {
                  sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar37 & 0x1f));
                }
                else {
                  sVar52 = -(uVar11 >> (bVar37 & 0x1f));
                }
                (*icdf_03)[lVar33] = sVar52 + uVar11;
                lVar33 = lVar33 + 1;
              } while (lVar33 != 3);
              paVar54 = pFVar14->interintra_mode_cdf[bVar39] + 4;
              *paVar54 = *paVar54 + (ushort)(uVar28 < 0x20);
            }
            pTVar47 = td;
            if ((0 < av1_wedge_params_lookup[BVar5].wedge_types) &&
               (aom_write_symbol((aom_writer *)pMVar70,*(ushort *)&pMVar41->field_0xa7 >> 10 & 1,
                                 pFVar14->wedge_interintra_cdf[BVar5],2), pTVar47 = td,
               (pMVar41->field_0xa8 & 4) != 0)) {
              aom_write_symbol((aom_writer *)pMVar70,(int)pMVar41->interintra_wedge_index,
                               pFVar14->wedge_idx_cdf[0] + (ulong)BVar5 + (ulong)BVar5 * 0x10,0x10);
              pTVar47 = td;
            }
          }
        }
      }
      pMVar71 = pMVar70;
      if (pMVar41->ref_frame[1] != '\0') {
        iVar30 = 0;
        if (((cpi->common).features.switchable_motion_mode == true) &&
           (pMVar41->overlappable_neighbors != '\0')) {
          iVar29 = (td->mb).e_mbd.cur_frame_force_integer_mv;
          if (iVar29 == 0) {
            bVar39 = block_size_high[pMVar41->bsize];
            if (block_size_wide[pMVar41->bsize] < block_size_high[pMVar41->bsize]) {
              bVar39 = block_size_wide[pMVar41->bsize];
            }
            td = pTVar47;
            if (((1 < (cpi->common).global_motion[pMVar41->ref_frame[0]].wmtype) &&
                ((pMVar41->mode - 0xf & 0xf7) == 0)) && (7 < bVar39)) goto LAB_0019e8d2;
          }
          bVar39 = block_size_high[pMVar41->bsize];
          if (block_size_wide[pMVar41->bsize] < block_size_high[pMVar41->bsize]) {
            bVar39 = block_size_wide[pMVar41->bsize];
          }
          if (((7 < bVar39) && (pMVar41->ref_frame[1] < '\0')) &&
             (0xf3 < (byte)(pMVar41->mode - 0x19))) {
            if (((iVar29 == 0) && ((cpi->common).features.allow_warped_motion != false)) &&
               (pMVar41->num_proj_ref != '\0')) {
              psVar45 = (td->mb).e_mbd.block_ref_scale_factors[0];
              iVar29 = psVar45->x_scale_fp;
              iVar30 = 2;
              if (((iVar29 == -1) || (iVar31 = psVar45->y_scale_fp, iVar31 == -1)) ||
                 (iVar31 == 0x4000 && iVar29 == 0x4000)) goto LAB_0019e8d2;
            }
            iVar30 = 1;
          }
        }
LAB_0019e8d2:
        if (iVar30 != 0) {
          if (iVar30 == 1) {
            MVar9 = pMVar41->motion_mode;
            paaVar48 = ((td->mb).e_mbd.tile_ctx)->obmc_cdf + pMVar41->bsize;
            td = pTVar47;
            od_ec_encode_cdf_q15
                      ((od_ec_enc *)pMVar70->ref_frame,(uint)(MVar9 == '\x01'),*paaVar48,2);
            pTVar47 = td;
            if ((char)(pMVar70->wm_params).wmmat[5] != '\0') {
              uVar28 = (*paaVar48)[2];
              bVar39 = (char)(uVar28 >> 4) + 4;
              uVar11 = (*paaVar48)[0];
              if (MVar9 == '\x01') {
                sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar39 & 0x1f));
              }
              else {
                sVar52 = -(uVar11 >> (bVar39 & 0x1f));
              }
              (*paaVar48)[0] = sVar52 + uVar11;
              (*paaVar48)[2] = uVar28 + (uVar28 < 0x20);
            }
          }
          else {
            bVar39 = pMVar41->motion_mode;
            pFVar18 = (td->mb).e_mbd.tile_ctx;
            BVar10 = pMVar41->bsize;
            paaVar66 = pFVar18->motion_mode_cdf + BVar10;
            td = pTVar47;
            od_ec_encode_cdf_q15((od_ec_enc *)pMVar70->ref_frame,(uint)bVar39,*paaVar66,3);
            pTVar47 = td;
            if ((char)(pMVar70->wm_params).wmmat[5] != '\0') {
              uVar28 = pFVar18->motion_mode_cdf[BVar10][3];
              bVar40 = (char)(uVar28 >> 4) + 4;
              lVar33 = 0;
              do {
                uVar11 = (*paaVar66)[lVar33];
                if (lVar33 < (char)bVar39) {
                  sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar40 & 0x1f));
                }
                else {
                  sVar52 = -(uVar11 >> (bVar40 & 0x1f));
                }
                (*paaVar66)[lVar33] = sVar52 + uVar11;
                lVar33 = lVar33 + 1;
              } while (lVar33 != 2);
              paVar54 = pFVar18->motion_mode_cdf[BVar10] + 3;
              *paVar54 = *paVar54 + (ushort)(uVar28 < 0x20);
            }
          }
        }
      }
      pMVar69 = pMVar71;
      if ('\0' < pMVar41->ref_frame[1]) {
        bVar39 = block_size_high[BVar5];
        if (block_size_wide[BVar5] < block_size_high[BVar5]) {
          bVar39 = block_size_wide[BVar5];
        }
        if (7 < bVar39) {
          uVar65 = 0;
          do {
            if (1 < uVar65) {
              if ((char)uVar65 == '\x02') {
                if (0 < av1_wedge_params_lookup[BVar5].wedge_types) goto LAB_0019ea73;
              }
              else if (((uVar65 & 0xff) < 2) || ((uVar65 & 0xff) == 3)) {
LAB_0019ea73:
                if (((cpi->common).seq_params)->enable_masked_compound != '\0') {
                  pMVar69 = (td->mb).e_mbd.left_mbmi;
                  pMVar70 = (td->mb).e_mbd.above_mbmi;
                  uVar32 = 0;
                  uVar65 = 0;
                  if (pMVar70 != (MB_MODE_INFO *)0x0) {
                    if (pMVar70->ref_frame[1] < '\x01') {
                      uVar65 = (uint)(pMVar70->ref_frame[0] == '\a') * 3;
                    }
                    else {
                      uVar65 = *(ushort *)&pMVar70->field_0xa7 >> 8 & 1;
                    }
                  }
                  if (pMVar69 != (MB_MODE_INFO *)0x0) {
                    if (pMVar69->ref_frame[1] < '\x01') {
                      uVar32 = (uint)(pMVar69->ref_frame[0] == '\a') * 3;
                    }
                    else {
                      uVar32 = *(ushort *)&pMVar69->field_0xa7 >> 8 & 1;
                    }
                  }
                  uVar49 = 5;
                  if (uVar32 + uVar65 < 5) {
                    uVar49 = (ulong)(uVar32 + uVar65);
                  }
                  uVar65 = *(ushort *)&pMVar41->field_0xa7 >> 8 & 1;
                  paaVar48 = pFVar14->comp_group_idx_cdf + uVar49;
                  td = pTVar47;
                  pMVar69 = pMVar71;
                  od_ec_encode_cdf_q15((od_ec_enc *)pMVar71->ref_frame,uVar65,*paaVar48,2);
                  pWVar25 = &pMVar71->wm_params;
                  pTVar47 = td;
                  pMVar71 = pMVar69;
                  if ((char)pWVar25->wmmat[5] != '\0') {
                    uVar28 = pFVar14->comp_group_idx_cdf[uVar49][2];
                    bVar40 = (char)(uVar28 >> 4) + 4;
                    uVar11 = (*paaVar48)[0];
                    if ((short)uVar65 == 0) {
                      sVar52 = -(uVar11 >> (bVar40 & 0x1f));
                    }
                    else {
                      sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar40 & 0x1f));
                    }
                    (*paaVar48)[0] = sVar52 + uVar11;
                    pFVar14->comp_group_idx_cdf[uVar49][2] = uVar28 + (uVar28 < 0x20);
                  }
                }
                break;
              }
            }
            uVar65 = uVar65 + 1;
          } while (uVar65 != 4);
        }
        if ((*(ushort *)&pMVar41->field_0xa7 >> 8 & 1) == 0) {
          pSVar19 = (cpi->common).seq_params;
          pMVar69 = pMVar71;
          if ((pSVar19->order_hint_info).enable_dist_wtd_comp != 0) {
            pMVar70 = *(td->mb).e_mbd.mi;
            bVar39 = pMVar70->ref_frame[0];
            iVar30 = -1;
            if ((byte)(bVar39 - 1) < 8) {
              iVar30 = (cpi->common).remapped_ref_idx[bVar39 - 1];
            }
            if (iVar30 == -1) {
              pRVar43 = (RefCntBuffer *)0x0;
            }
            else {
              pRVar43 = (cpi->common).ref_frame_map[iVar30];
            }
            bVar39 = pMVar70->ref_frame[1];
            iVar30 = -1;
            if ((byte)(bVar39 - 1) < 8) {
              iVar30 = (cpi->common).remapped_ref_idx[bVar39 - 1];
            }
            uVar65 = 0;
            if (iVar30 == -1) {
              pRVar61 = (RefCntBuffer *)0x0;
            }
            else {
              pRVar61 = (cpi->common).ref_frame_map[iVar30];
            }
            if (pRVar43 != (RefCntBuffer *)0x0) {
              uVar65 = pRVar43->order_hint;
            }
            iVar30 = 0;
            uVar32 = 0;
            if (pRVar61 != (RefCntBuffer *)0x0) {
              uVar32 = pRVar61->order_hint;
            }
            uVar59 = ((cpi->common).cur_frame)->order_hint;
            if ((pSVar19->order_hint_info).enable_order_hint == 0) {
              iVar29 = 0;
            }
            else {
              uVar32 = uVar32 - uVar59;
              uVar62 = 1 << ((byte)(pSVar19->order_hint_info).order_hint_bits_minus_1 & 0x1f);
              iVar30 = (uVar62 - 1 & uVar32) - (uVar62 & uVar32);
              uVar59 = uVar59 - uVar65;
              uVar65 = 1 << ((byte)(pSVar19->order_hint_info).order_hint_bits_minus_1 & 0x1f);
              iVar29 = (uVar65 - 1 & uVar59) - (uVar65 & uVar59);
            }
            pMVar70 = (pTVar47->mb).e_mbd.left_mbmi;
            pMVar21 = (pTVar47->mb).e_mbd.above_mbmi;
            if (pMVar21 == (MB_MODE_INFO *)0x0) {
              uVar49 = 0;
            }
            else if (pMVar21->ref_frame[1] < '\x01') {
              uVar49 = (ulong)(pMVar21->ref_frame[0] == '\a');
            }
            else {
              uVar49 = (ulong)(*(ushort *)&pMVar21->field_0xa7 >> 9 & 1);
            }
            if (pMVar70 == (MB_MODE_INFO *)0x0) {
              uVar46 = 0;
            }
            else if (pMVar70->ref_frame[1] < '\x01') {
              uVar46 = (ulong)(pMVar70->ref_frame[0] == '\a');
            }
            else {
              uVar46 = (ulong)(*(ushort *)&pMVar70->field_0xa7 >> 9 & 1);
            }
            iVar31 = -iVar30;
            if (0 < iVar30) {
              iVar31 = iVar30;
            }
            iVar30 = -iVar29;
            if (0 < iVar29) {
              iVar30 = iVar29;
            }
            lVar33 = uVar49 + uVar46 + (ulong)(iVar31 == iVar30) * 3;
            uVar65 = *(ushort *)&pMVar41->field_0xa7 >> 9 & 1;
            paaVar48 = pFVar14->compound_index_cdf + lVar33;
            td = pTVar47;
            od_ec_encode_cdf_q15((od_ec_enc *)pMVar71->ref_frame,uVar65,*paaVar48,2);
            pTVar47 = td;
            if ((char)(pMVar71->wm_params).wmmat[5] != '\0') {
              uVar28 = pFVar14->compound_index_cdf[lVar33][2];
              bVar39 = (char)(uVar28 >> 4) + 4;
              uVar11 = (*paaVar48)[0];
              if ((short)uVar65 == 0) {
                sVar52 = -(uVar11 >> (bVar39 & 0x1f));
              }
              else {
                sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar39 & 0x1f));
              }
              (*paaVar48)[0] = sVar52 + uVar11;
              pFVar14->compound_index_cdf[lVar33][2] = uVar28 + (uVar28 < 0x20);
            }
          }
        }
        else {
          td = pTVar47;
          pMVar70 = pMVar71;
          if ((7 < bVar39) && (0 < av1_wedge_params_lookup[BVar5].wedge_types)) {
            iVar30 = (pMVar41->interinter_comp).type - 2;
            paaVar48 = pFVar14->compound_type_cdf + BVar5;
            od_ec_encode_cdf_q15((od_ec_enc *)pMVar71->ref_frame,iVar30,*paaVar48,2);
            td = pTVar47;
            if ((char)(pMVar71->wm_params).wmmat[5] != '\0') {
              uVar28 = pFVar14->compound_type_cdf[BVar5][2];
              bVar39 = (char)(uVar28 >> 4) + 4;
              uVar11 = (*paaVar48)[0];
              if ((char)iVar30 < '\x01') {
                sVar52 = -(uVar11 >> (bVar39 & 0x1f));
              }
              else {
                sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar39 & 0x1f));
              }
              (*paaVar48)[0] = sVar52 + uVar11;
              pFVar14->compound_type_cdf[BVar5][2] = uVar28 + (uVar28 < 0x20);
            }
          }
          pMVar69 = pMVar70;
          if ((pMVar41->interinter_comp).type == '\x02') {
            iVar30 = (int)(pMVar41->interinter_comp).wedge_index;
            uVar49 = (ulong)BVar5;
            paVar54 = pFVar14->wedge_idx_cdf[0] + (ulong)BVar5 + uVar49 * 0x10;
            od_ec_encode_cdf_q15((od_ec_enc *)pMVar70->ref_frame,iVar30,paVar54,0x10);
            if ((char)(pMVar70->wm_params).wmmat[5] != '\0') {
              uVar28 = pFVar14->wedge_idx_cdf[0][(ulong)BVar5 + uVar49 * 0x10 + 0x10];
              bVar39 = (char)(uVar28 >> 4) + 5;
              lVar33 = 0;
              do {
                uVar11 = paVar54[lVar33];
                if (lVar33 < iVar30) {
                  sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar39 & 0x1f));
                }
                else {
                  sVar52 = -(uVar11 >> (bVar39 & 0x1f));
                }
                paVar54[lVar33] = sVar52 + uVar11;
                lVar33 = lVar33 + 1;
              } while (lVar33 != 0xf);
              paVar54 = pFVar14->wedge_idx_cdf[0] + (ulong)BVar5 + uVar49 * 0x10 + 0x10;
              *paVar54 = *paVar54 + (ushort)(uVar28 < 0x20);
            }
            uVar65 = (uint)(pMVar41->interinter_comp).wedge_sign;
          }
          else {
            uVar65 = (pMVar41->interinter_comp).mask_type & 1;
          }
          od_ec_encode_bool_q15((od_ec_enc *)pMVar70->ref_frame,uVar65,0x4000);
          pTVar47 = td;
        }
      }
      pMVar41 = *(td->mb).e_mbd.mi;
      if (((pMVar41->field_0xa7 & 0x40) == 0) && (pMVar41->motion_mode != '\x02')) {
        pFVar18 = (td->mb).e_mbd.tile_ctx;
        if ((pMVar41->mode == '\x17') || (pMVar41->mode == '\x0f')) {
          bVar39 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [pMVar41->bsize];
          if ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
              [pMVar41->bsize] <
              "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
              [pMVar41->bsize]) {
            bVar39 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [pMVar41->bsize];
          }
          if (1 < bVar39) {
            lVar33 = 0;
            do {
              if ((td->mb).e_mbd.global_motion[pMVar41->ref_frame[lVar33]].wmtype == '\x01')
              goto LAB_0019ef56;
            } while (('\0' < pMVar41->ref_frame[1]) &&
                    (bVar67 = lVar33 == 0, lVar33 = lVar33 + 1, bVar67));
            goto LAB_0019cbae;
          }
        }
LAB_0019ef56:
        if ((cpi->common).features.interp_filter == MULTITAP_SHARP2) {
          pMVar34 = pMVar69->ref_frame;
          iVar30 = 0;
          td = pTVar47;
          do {
            iVar29 = av1_get_pred_context_switchable_interp(xd_01,iVar30);
            uVar65 = (pMVar41->interp_filters).as_int >> 0x10;
            if (iVar30 == 0) {
              uVar65 = (pMVar41->interp_filters).as_int;
            }
            paaVar66 = pFVar18->switchable_interp_cdf + iVar29;
            od_ec_encode_cdf_q15((od_ec_enc *)pMVar34,(int)((ulong)uVar65 & 0xff),*paaVar66,3);
            if ((char)(pMVar69->wm_params).wmmat[5] != '\0') {
              uVar28 = (*paaVar66)[3];
              bVar39 = (char)(uVar28 >> 4) + 4;
              lVar33 = 0;
              do {
                uVar11 = (*paaVar66)[lVar33];
                if (lVar33 < (char)uVar65) {
                  sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar39 & 0x1f));
                }
                else {
                  sVar52 = -(uVar11 >> (bVar39 & 0x1f));
                }
                (*paaVar66)[lVar33] = sVar52 + uVar11;
                lVar33 = lVar33 + 1;
              } while (lVar33 != 2);
              (*paaVar66)[3] = (*paaVar66)[3] + (ushort)(uVar28 < 0x20);
            }
            td->interp_filter_selected[(ulong)uVar65 & 0xff] =
                 td->interp_filter_selected[(ulong)uVar65 & 0xff] + 1;
            pTVar47 = td;
          } while ((iVar30 == 0) &&
                  (iVar30 = 1, ((cpi->common).seq_params)->enable_dual_filter != '\0'));
        }
      }
    }
  }
LAB_0019cbae:
  local_40 = (td->mb).e_mbd.plane;
  pMVar34 = pMVar69->ref_frame;
  lVar33 = 0;
  do {
    bVar39 = (pMVar16->palette_mode_info).palette_size[lVar33];
    uVar49 = (ulong)bVar39;
    if (bVar39 != 0) {
      bVar40 = block_size_wide[pMVar16->bsize];
      iVar30 = (td->mb).e_mbd.mb_to_right_edge;
      bVar37 = (byte)local_40[lVar33].subsampling_x;
      bVar38 = (byte)local_40[lVar33].subsampling_y;
      bVar67 = lVar33 != 0;
      bVar6 = block_size_high[pMVar16->bsize];
      lVar60 = 0x294e;
      if (!bVar67) {
        lVar60 = 0x26d8;
      }
      iVar29 = (td->mb).e_mbd.mb_to_bottom_edge;
      bVar22 = bVar38 & 0x1f;
      pTVar42 = *local_38;
      uVar65 = 0x1f;
      if (bVar39 != 0) {
        for (; bVar39 >> uVar65 == 0; uVar65 = uVar65 - 1) {
        }
      }
      uVar59 = uVar65 ^ 0x1f;
      uVar32 = (byte)*pTVar42 & 7;
      iVar31 = (1 << (-(char)uVar59 & 0x1fU)) - (uint)bVar39;
      if ((int)uVar32 < iVar31) {
        td = pTVar47;
        if (uVar59 != 0x1f) {
          iVar31 = uVar65 + 1;
          do {
            od_ec_encode_bool_q15
                      ((od_ec_enc *)pMVar34,(uint)((uVar32 >> (iVar31 - 2U & 0x1f) & 1) != 0),0x4000
                      );
            iVar31 = iVar31 + -1;
            td = pTVar47;
          } while (1 < iVar31);
        }
      }
      else {
        if (uVar59 != 0x1f) {
          iVar50 = uVar65 + 1;
          do {
            od_ec_encode_bool_q15
                      ((od_ec_enc *)pMVar34,
                       (uint)(((uint)(((int)(uVar32 - iVar31) >> 1) + iVar31) >>
                               (iVar50 - 2U & 0x1f) & 1) != 0),0x4000);
            iVar50 = iVar50 + -1;
          } while (1 < iVar50);
        }
        od_ec_encode_bool_q15((od_ec_enc *)pMVar34,uVar32 - iVar31 & 1,0x4000);
        td = pTVar47;
      }
      iVar30 = (((int)((iVar30 >> 0x1f & iVar30 >> 3) + (uint)bVar40) >> (bVar37 & 0x1f)) +
               (uint)(bVar40 >> (bVar37 & 0x1f) < 4 && bVar67) * 2) *
               (((int)((iVar29 >> 0x1f & iVar29 >> 3) + (uint)bVar6) >> bVar22) +
               (uint)(bVar6 >> (bVar38 & 0x1f) < 4 && bVar67) * 2);
      pTVar42 = pTVar42 + 1;
      if (1 < iVar30) {
        uVar65 = 2;
        if (2 < bVar39) {
          uVar65 = (uint)bVar39;
        }
        iVar29 = 0 >> bVar22;
        do {
          icdf = (uint16_t *)
                 ((long)pFVar14 +
                 (long)((char)*pTVar42 >> 4) * 0x12 + uVar49 * 0x5a + lVar60 + -0xb4);
          uVar32 = (byte)*pTVar42 & 7;
          od_ec_encode_cdf_q15((od_ec_enc *)pMVar34,uVar32,icdf,(uint)bVar39);
          if ((char)(pMVar69->wm_params).wmmat[5] != '\0') {
            uVar28 = icdf[uVar49];
            bVar40 = (char)(uVar28 >> 4) + (3 < bVar39) + 4;
            uVar46 = 0;
            do {
              uVar11 = icdf[uVar46];
              if (uVar46 < uVar32) {
                sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar40 & 0x1f));
              }
              else {
                sVar52 = -(uVar11 >> (bVar40 & 0x1f));
              }
              icdf[uVar46] = sVar52 + uVar11;
              uVar46 = uVar46 + 1;
            } while (uVar65 - 1 != uVar46);
            icdf[uVar49] = icdf[uVar49] + (ushort)(uVar28 < 0x20);
          }
          pTVar42 = pTVar42 + 1;
          bVar67 = iVar29 != iVar30 + -2;
          iVar29 = iVar29 + 1;
        } while (bVar67);
      }
      *local_38 = pTVar42;
      cpi = local_50;
      pTVar47 = td;
    }
    uVar49 = local_48;
  } while ((((cpi->common).seq_params)->monochrome == '\0') &&
          (bVar67 = lVar33 == 0, lVar33 = lVar33 + 1, bVar67));
  bVar67 = true;
  if (-1 < (char)*(ushort *)&pMVar16->field_0xa7) {
    bVar67 = '\0' < pMVar16->ref_frame[0];
  }
  if (((bool)(pMVar16->skip_txfm != '\0' & bVar67 |
             (local_60 == 0 || (cpi->common).features.tx_mode != '\x02'))) ||
     ((td->mb).e_mbd.lossless[*(ushort *)&pMVar16->field_0xa7 & 7] != 0)) {
    bVar39 = (td->mb).e_mbd.width;
    __n = (size_t)bVar39;
    bVar40 = (td->mb).e_mbd.height;
    bVar67 = (bool)(pMVar16->skip_txfm != '\0' & bVar67);
    if (bVar67) {
      bVar37 = bVar40 * '\x04';
    }
    else {
      bVar37 = (byte)tx_size_high[pMVar16->tx_size];
    }
    if (__n != 0) {
      __s = (pTVar47->mb).e_mbd.above_txfm_context;
      if (bVar67) {
        uVar65 = (uint)bVar39 * 4 & 0xff;
      }
      else {
        uVar65 = tx_size_wide[pMVar16->tx_size];
      }
LAB_0019cf93:
      memset(__s,uVar65,__n);
    }
  }
  else {
    if (bVar67) {
      iVar30 = 0;
      uVar65 = 0;
      if ((td->mb).e_mbd.lossless[*(ushort *)&(*(td->mb).e_mbd.mi)->field_0xa7 & 7] == 0) {
        uVar65 = (uint)""[local_60];
      }
      iVar29 = *(int *)((long)tx_size_high_unit + (ulong)(uVar65 << 2));
      iVar31 = *(int *)((long)tx_size_wide_unit + (ulong)(uVar65 << 2));
      do {
        iVar50 = 0;
        do {
          in_stack_fffffffffffffee8 = pMVar69;
          pMVar69 = in_stack_fffffffffffffee8;
          write_tx_size_vartx(xd_01,pMVar16,(TX_SIZE)uVar65,0,iVar30,iVar50,
                              (aom_writer *)in_stack_fffffffffffffee8);
          iVar50 = iVar50 + iVar31;
        } while (iVar50 < (int)uVar49);
        iVar30 = iVar30 + iVar29;
      } while (iVar30 < (int)local_58);
      goto LAB_0019cfbe;
    }
    pMVar41 = *(td->mb).e_mbd.mi;
    uVar49 = (ulong)pMVar41->bsize;
    if (uVar49 != 0) {
      bVar40 = ""[uVar49];
      uVar65 = (uint)bVar40;
      bVar67 = (td->mb).e_mbd.up_available;
      bVar8 = (td->mb).e_mbd.left_available;
      bVar39 = *(td->mb).e_mbd.above_txfm_context;
      if ((bVar67 == true) &&
         ((pMVar70 = (td->mb).e_mbd.above_mbmi, (pMVar70->field_0xa7 & 0x80) != 0 ||
          ('\0' < pMVar70->ref_frame[0])))) {
        bVar39 = block_size_wide[pMVar70->bsize];
      }
      bVar37 = pMVar41->tx_size;
      bVar38 = *(td->mb).e_mbd.left_txfm_context;
      if ((bVar8 != false) &&
         ((pMVar41 = (pTVar47->mb).e_mbd.left_mbmi, (pMVar41->field_0xa7 & 0x80) != 0 ||
          ('\0' < pMVar41->ref_frame[0])))) {
        bVar38 = block_size_high[pMVar41->bsize];
      }
      iVar30 = 0;
      if (bVar40 != bVar37) {
        iVar30 = 0;
        do {
          iVar30 = iVar30 + 1;
          bVar40 = ""[bVar40];
        } while (bVar40 != bVar37);
      }
      bVar40 = bsize_to_max_depth_bsize_to_max_depth_table[uVar49];
      paaVar66 = ((pTVar47->mb).e_mbd.tile_ctx)->tx_size_cdf
                 [(ulong)(byte)bsize_to_tx_size_cat_bsize_to_tx_size_depth_table[uVar49] - 1] +
                 (ulong)(byte)(bVar67 & *(int *)((long)tx_size_wide + (ulong)(uVar65 * 4)) <=
                                        (int)(uint)bVar39) +
                 (ulong)(byte)(bVar8 & *(int *)((long)tx_size_high + (ulong)(uVar65 * 4)) <=
                                       (int)(uint)bVar38);
      td = pTVar47;
      od_ec_encode_cdf_q15((od_ec_enc *)pMVar34,iVar30,*paaVar66,bVar40 + 1);
      pTVar47 = td;
      if ((char)(pMVar69->wm_params).wmmat[5] != '\0') {
        uVar28 = (*paaVar66)[(ulong)bVar40 + 1];
        bVar39 = (char)(uVar28 >> 4) + 4;
        uVar49 = 1;
        if (1 < bVar40) {
          uVar49 = (ulong)(uint)bVar40;
        }
        uVar46 = 0;
        do {
          uVar11 = (*paaVar66)[uVar46];
          if ((long)uVar46 < (long)(char)iVar30) {
            sVar52 = (short)((int)(0x8000 - (uint)uVar11) >> (bVar39 & 0x1f));
          }
          else {
            sVar52 = -(uVar11 >> (bVar39 & 0x1f));
          }
          (*paaVar66)[uVar46] = sVar52 + uVar11;
          uVar46 = uVar46 + 1;
        } while (uVar49 != uVar46);
        (*paaVar66)[(ulong)bVar40 + 1] = (*paaVar66)[(ulong)bVar40 + 1] + (ushort)(uVar28 < 0x20);
      }
    }
    __n = (size_t)(td->mb).e_mbd.width;
    bVar40 = (td->mb).e_mbd.height;
    bVar37 = *(byte *)(tx_size_high + pMVar16->tx_size);
    if (__n != 0) {
      __s = (td->mb).e_mbd.above_txfm_context;
      uVar65 = tx_size_wide[pMVar16->tx_size];
      goto LAB_0019cf93;
    }
  }
  if (bVar40 != 0) {
    memset((pTVar47->mb).e_mbd.left_txfm_context,(uint)bVar37,(ulong)bVar40);
  }
LAB_0019cfbe:
  if (pMVar16->skip_txfm == '\0') {
    iVar30 = aom_tell_size((aom_writer *)pMVar69);
    pMVar16 = *(pTVar47->mb).e_mbd.mi;
    BVar5 = pMVar16->bsize;
    if (((pMVar16->field_0xa7 & 0x80) == 0) && (pMVar16->ref_frame[0] < '\x01')) {
      av1_write_intra_coeffs_mb(cm,&pTVar47->mb,(aom_writer *)pMVar69,BVar5);
      pTVar68 = pTVar47;
    }
    else {
      local_68 = 0;
      bVar39 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar5];
      uVar65 = 0x10;
      if (bVar39 < 0x10) {
        uVar65 = (uint)bVar39;
      }
      local_48 = CONCAT44(local_48._4_4_,uVar65);
      bVar40 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar5];
      local_60 = CONCAT44(local_60._4_4_,(uint)bVar40);
      uVar65 = 0x10;
      if (bVar40 < 0x10) {
        uVar65 = (uint)bVar40;
      }
      local_58 = CONCAT44(local_58._4_4_,uVar65);
      local_70 = 0;
      uVar7 = ((local_50->common).seq_params)->monochrome;
      uVar65 = 0;
      pTVar68 = pTVar47;
      do {
        uVar32 = 0;
        do {
          pMVar51 = (MACROBLOCKD *)0x0;
          while ((pMVar51 == (MACROBLOCKD *)0x0 || ((pTVar47->mb).e_mbd.is_chroma_ref == true))) {
            iVar29 = local_40[(long)pMVar51].subsampling_x;
            iVar31 = local_40[(long)pMVar51].subsampling_y;
            BVar5 = av1_ss_size_lookup[pMVar16->bsize][iVar29][iVar31];
            uVar59 = 0;
            if ((pTVar47->mb).e_mbd.lossless[*(ushort *)&(*(pTVar47->mb).e_mbd.mi)->field_0xa7 & 7]
                == 0) {
              bVar40 = ""[BVar5];
              if (pMVar51 == (MACROBLOCKD *)0x0) {
LAB_0019d134:
                bVar37 = bVar40;
              }
              else if (bVar40 < 0x11) {
                bVar37 = 3;
                if ((1 < bVar40 - 0xb) && (bVar40 != 4)) goto LAB_0019d134;
              }
              else if (bVar40 == 0x11) {
                bVar37 = 9;
              }
              else {
                if (bVar40 != 0x12) goto LAB_0019d134;
                bVar37 = 10;
              }
              uVar59 = (uint)bVar37;
            }
            bVar40 = *(byte *)((long)iVar31 + (long)iVar29 * 2 + 0x51e750);
            uVar53 = uVar65 >> ((byte)iVar31 & 0x1f);
            uVar62 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [bVar40] + uVar53;
            if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                           [BVar5] <=
                (int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                      [bVar40] + uVar53)) {
              uVar62 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                             [BVar5];
            }
            aVar64 = uVar32 >> ((byte)iVar29 & 0x1f);
            aVar23 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [bVar40] + aVar64;
            if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [BVar5] <=
                (int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [bVar40] + aVar64)) {
              aVar23 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                             [BVar5];
            }
            if (uVar53 < uVar62) {
              iVar29 = *(int *)((long)tx_size_wide_unit + (ulong)(uVar59 << 2));
              iVar31 = *(int *)((long)tx_size_high_unit + (ulong)(uVar59 << 2));
              local_38 = (TokenExtra **)CONCAT44(local_38._4_4_,uVar62);
              do {
                if (aVar64 < aVar23) {
                  iVar50 = *(int *)((long)&local_70 + (long)pMVar51 * 4);
                  bit_depth = aVar64;
                  do {
                    in_stack_fffffffffffffee8 =
                         (MB_MODE_INFO *)
                         CONCAT44((int)((ulong)in_stack_fffffffffffffee8 >> 0x20),(uint)BVar5);
                    pack_txb_tokens((aom_writer *)pMVar69,cm,&pTVar47->mb,(TokenExtra **)xd_01,
                                    (TokenExtra *)pMVar16,pMVar51,in_stack_fffffffffffffee8,iVar50,
                                    (BLOCK_SIZE)uVar53,bit_depth,uVar59,(int)pTVar68,(int)pMVar69,
                                    (TX_SIZE)iVar29,(TOKEN_STATS *)xd_01);
                    pTVar47 = pTVar68;
                    iVar50 = iVar50 + iVar31 * iVar29;
                    bit_depth = bit_depth + iVar29;
                    pTVar68 = pTVar47;
                  } while ((int)bit_depth < (int)aVar23);
                  *(int *)((long)&local_70 + (long)pMVar51 * 4) = iVar50;
                  uVar62 = (uint)local_38;
                }
                uVar53 = uVar53 + iVar31;
              } while ((int)uVar53 < (int)uVar62);
            }
            if ((uVar7 != '\0') ||
               (bVar67 = (MACROBLOCKD *)0x1 < pMVar51,
               pMVar51 = (MACROBLOCKD *)((long)&pMVar51->mi_row + 1), bVar67)) break;
          }
          uVar32 = uVar32 + (int)local_48;
        } while (uVar32 < bVar39);
        uVar65 = uVar65 + (int)local_58;
      } while (uVar65 < (uint)local_60);
    }
    iVar29 = aom_tell_size((aom_writer *)pMVar69);
    pTVar68->coefficient_size = pTVar68->coefficient_size + (iVar29 - iVar30);
  }
  return;
}

Assistant:

static inline void write_modes_b(AV1_COMP *cpi, ThreadData *const td,
                                 const TileInfo *const tile, aom_writer *w,
                                 const TokenExtra **tok,
                                 const TokenExtra *const tok_end, int mi_row,
                                 int mi_col) {
  const AV1_COMMON *cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  MACROBLOCKD *xd = &td->mb.e_mbd;
  FRAME_CONTEXT *tile_ctx = xd->tile_ctx;
  const int grid_idx = mi_row * mi_params->mi_stride + mi_col;
  xd->mi = mi_params->mi_grid_base + grid_idx;
  td->mb.mbmi_ext_frame =
      cpi->mbmi_ext_info.frame_base +
      get_mi_ext_idx(mi_row, mi_col, cm->mi_params.mi_alloc_bsize,
                     cpi->mbmi_ext_info.stride);
  xd->tx_type_map = mi_params->tx_type_map + grid_idx;
  xd->tx_type_map_stride = mi_params->mi_stride;

  const MB_MODE_INFO *mbmi = xd->mi[0];
  const BLOCK_SIZE bsize = mbmi->bsize;
  assert(bsize <= cm->seq_params->sb_size ||
         (bsize >= BLOCK_SIZES && bsize < BLOCK_SIZES_ALL));

  const int bh = mi_size_high[bsize];
  const int bw = mi_size_wide[bsize];
  set_mi_row_col(xd, tile, mi_row, bh, mi_col, bw, mi_params->mi_rows,
                 mi_params->mi_cols);

  xd->above_txfm_context = cm->above_contexts.txfm[tile->tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);

  write_mbmi_b(cpi, td, w);

  for (int plane = 0; plane < AOMMIN(2, av1_num_planes(cm)); ++plane) {
    const uint8_t palette_size_plane =
        mbmi->palette_mode_info.palette_size[plane];
    assert(!mbmi->skip_mode || !palette_size_plane);
    if (palette_size_plane > 0) {
      assert(mbmi->use_intrabc == 0);
      assert(av1_allow_palette(cm->features.allow_screen_content_tools,
                               mbmi->bsize));
      assert(!plane || xd->is_chroma_ref);
      int rows, cols;
      av1_get_block_dimensions(mbmi->bsize, plane, xd, NULL, NULL, &rows,
                               &cols);
      assert(*tok < tok_end);
      MapCdf map_pb_cdf = plane ? tile_ctx->palette_uv_color_index_cdf
                                : tile_ctx->palette_y_color_index_cdf;
      pack_map_tokens(w, tok, palette_size_plane, rows * cols, map_pb_cdf);
    }
  }

  const int is_inter_tx = is_inter_block(mbmi);
  const int skip_txfm = mbmi->skip_txfm;
  const uint8_t segment_id = mbmi->segment_id;
  if (cm->features.tx_mode == TX_MODE_SELECT && block_signals_txsize(bsize) &&
      !(is_inter_tx && skip_txfm) && !xd->lossless[segment_id]) {
    if (is_inter_tx) {  // This implies skip flag is 0.
      const TX_SIZE max_tx_size = get_vartx_max_txsize(xd, bsize, 0);
      const int txbh = tx_size_high_unit[max_tx_size];
      const int txbw = tx_size_wide_unit[max_tx_size];
      const int width = mi_size_wide[bsize];
      const int height = mi_size_high[bsize];
      for (int idy = 0; idy < height; idy += txbh) {
        for (int idx = 0; idx < width; idx += txbw) {
          write_tx_size_vartx(xd, mbmi, max_tx_size, 0, idy, idx, w);
        }
      }
    } else {
      write_selected_tx_size(xd, w);
      set_txfm_ctxs(mbmi->tx_size, xd->width, xd->height, 0, xd);
    }
  } else {
    set_txfm_ctxs(mbmi->tx_size, xd->width, xd->height,
                  skip_txfm && is_inter_tx, xd);
  }

  if (!mbmi->skip_txfm) {
    int start = aom_tell_size(w);

    write_tokens_b(cpi, &td->mb, w, tok, tok_end);

    const int end = aom_tell_size(w);
    td->coefficient_size += end - start;
  }
}